

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_open_output_string_op(sexp ctx,sexp self,sexp_sint_t n)

{
  sexp self_00;
  sexp psVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp in_stack_ffffffffffffffc8;
  sexp ctx_00;
  
  memset(&stack0xffffffffffffffd0,0,0x10);
  psVar1 = (sexp)&stack0xffffffffffffffe0;
  ctx_00 = (sexp)(((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffd0;
  self_00 = sexp_make_output_port(ctx_00,(FILE *)psVar1,in_stack_ffffffffffffffc8);
  if ((((ulong)self_00 & 3) != 0) || (self_00->tag != 0x13)) {
    psVar1 = sexp_cons_op((sexp)in_RDX,self_00,(sexp_sint_t)ctx_00,psVar1,in_stack_ffffffffffffffc8)
    ;
    (self_00->value).type.cpl = psVar1;
    psVar1 = sexp_make_bytes_op((sexp)in_RDI,(sexp)in_RSI,in_RDX,self_00,ctx_00);
    (((self_00->value).type.cpl)->value).type.name = psVar1;
    if ((((((self_00->value).type.cpl)->value).stack.length & 3) == 0) &&
       (((((self_00->value).type.cpl)->value).type.name)->tag == 0x13)) {
      self_00 = (sexp)(((self_00->value).type.cpl)->value).flonum;
    }
    else {
      (self_00->value).type.setters =
           (sexp)((long)&((((self_00->value).type.cpl)->value).type.name)->value + 8);
      (self_00->value).port.size = 0x1000;
      (self_00->value).type.print = (sexp)0x0;
      (self_00->value).flonum_bits[0x2a] = '\0';
    }
  }
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)ctx_00;
  return self_00;
}

Assistant:

sexp sexp_open_output_string_op (sexp ctx, sexp self, sexp_sint_t n) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_make_output_port(ctx, NULL, SEXP_FALSE);
  if (!sexp_exceptionp(res)) {
    sexp_port_cookie(res) = sexp_cons(ctx, SEXP_FALSE, SEXP_NULL);
    sexp_car(sexp_port_cookie(res)) =
      sexp_make_bytes(ctx, sexp_make_fixnum(SEXP_PORT_BUFFER_SIZE), SEXP_VOID);
    if (sexp_exceptionp(sexp_car(sexp_port_cookie(res)))) {
      res = sexp_car(sexp_port_cookie(res));
    } else {
      sexp_port_buf(res) = sexp_bytes_data(sexp_car(sexp_port_cookie(res)));
      sexp_port_size(res) = SEXP_PORT_BUFFER_SIZE;
      sexp_port_offset(res) = 0;
      sexp_port_binaryp(res) = 0;
    }
  }
  sexp_gc_release1(ctx);
  return res;
}